

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_counted_base_gcc_x86.hpp
# Opt level: O1

void __thiscall boost::detail::sp_counted_base::release(sp_counted_base *this)

{
  sp_counted_base *psVar1;
  int iVar2;
  
  LOCK();
  psVar1 = this + 8;
  iVar2 = *(int *)psVar1;
  *(int *)psVar1 = *(int *)psVar1 + -1;
  UNLOCK();
  if (iVar2 == 1) {
    (**(code **)(*(long *)this + 0x10))();
    LOCK();
    psVar1 = this + 0xc;
    iVar2 = *(int *)psVar1;
    *(int *)psVar1 = *(int *)psVar1 + -1;
    UNLOCK();
    if (iVar2 == 1) {
      (**(code **)(*(long *)this + 0x18))(this);
      return;
    }
  }
  return;
}

Assistant:

inline int atomic_exchange_and_add( int * pw, int dv )
{
    // int r = *pw;
    // *pw += dv;
    // return r;

    int r;

    __asm__ __volatile__
    (
        "lock\n\t"
        "xadd %1, %0":
        "=m"( *pw ), "=r"( r ): // outputs (%0, %1)
        "m"( *pw ), "1"( dv ): // inputs (%2, %3 == %1)
        "memory", "cc" // clobbers
    );

    return r;
}